

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformanceTesting.cpp
# Opt level: O0

void shortestPathPerfTest
               (Graph<std::pair<double,_double>_> *graph,function<Path_(int,_int)> *spAlgorithm,
               char test)

{
  int iVar1;
  size_type sVar2;
  pointer ppVar3;
  rep rVar4;
  long *plVar5;
  ostream *poVar6;
  allocator local_169;
  string local_168 [32];
  double local_148;
  double average;
  rep local_138;
  duration<long,_std::ratio<1L,_1000000000L>_> local_130;
  duration<long,_std::ratio<1L,_1000000L>_> local_128;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> duration;
  time_point stop;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  time_point start;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_e8;
  iterator iter;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map;
  long lStack_a0;
  int i;
  long max_d;
  long min_d;
  long total;
  function<bool_(int)> local_80;
  allocator local_49;
  string local_48 [32];
  int local_28;
  int local_24;
  int num_iter;
  int id_dest;
  int id_src;
  char test_local;
  function<Path_(int,_int)> *spAlgorithm_local;
  Graph<std::pair<double,_double>_> *graph_local;
  
  id_dest._3_1_ = test;
  _id_src = spAlgorithm;
  spAlgorithm_local = (function<Path_(int,_int)> *)graph;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Number of iterations: ",&local_49);
  std::function<bool(int)>::function<__0,void>
            ((function<bool(int)> *)&local_80,(anon_class_1_0_00000001 *)((long)&total + 7));
  getOption(&local_28,(string *)local_48,&local_80);
  std::function<bool_(int)>::~function(&local_80);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  min_d = 0;
  max_d = 0x7fffffffffffffff;
  lStack_a0 = 0;
  for (map._M_h._M_single_bucket._4_4_ = 0; map._M_h._M_single_bucket._4_4_ < local_28;
      map._M_h._M_single_bucket._4_4_ = map._M_h._M_single_bucket._4_4_ + 1) {
    Graph<std::pair<double,_double>_>::getVertexMap
              ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)&iter,(Graph<std::pair<double,_double>_> *)spAlgorithm_local);
    local_e8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
         ::begin((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)&iter);
    iVar1 = rand();
    sVar2 = std::
            unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::size((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)&iter);
    std::advance<std::__detail::_Node_iterator<std::pair<int_const,int>,false,false>,unsigned_long>
              ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_e8,
               (ulong)(long)iVar1 % sVar2);
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_e8);
    num_iter = ppVar3->first;
    start.__d.__r =
         (duration)
         std::
         unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
         ::begin((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)&iter);
    local_e8._M_cur = (__node_type *)start.__d.__r;
    iVar1 = rand();
    sVar2 = std::
            unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::size((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)&iter);
    std::advance<std::__detail::_Node_iterator<std::pair<int_const,int>,false,false>,unsigned_long>
              ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_e8,
               (ulong)(long)iVar1 % sVar2);
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_e8);
    local_24 = ppVar3->first;
    local_f8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    std::function<Path_(int,_int)>::operator()((Path *)&stop,_id_src,num_iter,local_24);
    Path::~Path((Path *)&stop);
    duration.__r = std::chrono::_V2::system_clock::now();
    local_130.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&duration,&local_f8);
    local_128.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_130);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_128);
    min_d = min_d + rVar4;
    local_138 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_128);
    plVar5 = std::min<long>(&max_d,&local_138);
    max_d = *plVar5;
    average = (double)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_128);
    plVar5 = std::max<long>(&stack0xffffffffffffff60,(long *)&average);
    lStack_a0 = *plVar5;
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)&iter);
  }
  local_148 = (double)min_d / (double)local_28;
  poVar6 = std::operator<<((ostream *)&std::cout,"Minimum run time: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,max_d);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Maximum run time: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,lStack_a0);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Average run time: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_148);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Total run time: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,min_d);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"ENTER to go back",&local_169);
  enterWait((string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  return;
}

Assistant:

void shortestPathPerfTest(Graph<coordinates> &graph, const function<Path (int, int)> &spAlgorithm, char test) {
    int id_src, id_dest, num_iter;
    getOption(num_iter, "Number of iterations: ");

    long total = 0, min_d = LONG_MAX, max_d = 0;

    for (int i = 0; i < num_iter; i++) {
        auto map = graph.getVertexMap();
        auto iter = map.begin();
        advance(iter, rand() % map.size());
        id_src = iter->first;
        iter = map.begin();
        advance(iter, rand() % map.size());
        id_dest = iter->first;
        auto start = high_resolution_clock::now();
        spAlgorithm(id_src, id_dest);
        auto stop = high_resolution_clock::now();
        auto duration = duration_cast<microseconds>(stop - start);
        total += duration.count();
        min_d = min(min_d, (long) duration.count());
        max_d = max(max_d, (long) duration.count());
    }

    double average = (double) total / (double) num_iter;

    cout << "Minimum run time: " << min_d << endl;
    cout << "Maximum run time: " << max_d << endl;
    cout << "Average run time: " << average << endl;
    cout << "Total run time: " << total << endl;

    enterWait();
}